

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file_dictionary_handler.c
# Opt level: O0

ion_err_t ffdict_close_dictionary(ion_dictionary_t *dictionary)

{
  ion_err_t err;
  ion_dictionary_t *dictionary_local;
  
  dictionary_local._7_1_ = flat_file_close((ion_flat_file_t *)dictionary->instance);
  free(dictionary->instance);
  dictionary->instance = (ion_dictionary_parent_t *)0x0;
  if (dictionary_local._7_1_ == '\0') {
    dictionary_local._7_1_ = '\0';
  }
  return dictionary_local._7_1_;
}

Assistant:

ion_err_t
ffdict_close_dictionary(
	ion_dictionary_t *dictionary
) {
	ion_err_t err = flat_file_close((ion_flat_file_t *) dictionary->instance);

	free(dictionary->instance);
	dictionary->instance = NULL;

	if (err_ok != err) {
		return err;
	}

	return err_ok;
}